

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SeverityTask::SeverityTask
          (SeverityTask *this,KnownSystemName knownNameId,ElabSystemTaskKind taskKind)

{
  undefined4 in_EDX;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__SeverityTask_01012f78;
  *(undefined4 *)(in_RDI + 7) = in_EDX;
  return;
}

Assistant:

SeverityTask(KnownSystemName knownNameId, ElabSystemTaskKind taskKind) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), taskKind(taskKind) {}